

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O3

bool __thiscall sf::Font::loadFromFile(Font *this,string *filename)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  FT_Face_conflict face;
  FT_Stroker stroker;
  FT_Library library;
  void *local_50;
  void *local_48;
  void *local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  cleanup(this,(EVP_PKEY_CTX *)filename);
  piVar2 = (int *)operator_new(4);
  *piVar2 = 1;
  this->m_refCount = piVar2;
  iVar1 = FT_Init_FreeType(&local_40);
  if (iVar1 == 0) {
    this->m_library = local_40;
    iVar1 = FT_New_Face(local_40,(filename->_M_dataplus)._M_p,0,&local_50);
    if (iVar1 == 0) {
      iVar1 = FT_Stroker_New(this->m_library,&local_48);
      if (iVar1 == 0) {
        iVar1 = FT_Select_Charmap(local_50,0x756e6963);
        if (iVar1 == 0) {
          this->m_stroker = local_48;
          this->m_face = local_50;
          pcVar6 = *(char **)((long)local_50 + 0x28);
          local_38 = local_28;
          if (pcVar6 == (char *)0x0) {
            local_30 = 0;
            local_28[0] = 0;
          }
          else {
            sVar4 = strlen(pcVar6);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_38,pcVar6,pcVar6 + sVar4);
          }
          std::__cxx11::string::operator=((string *)&this->m_info,(string *)&local_38);
          if (local_38 != local_28) {
            operator_delete(local_38);
          }
          return true;
        }
        poVar3 = err();
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Failed to load font \"",0x15);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(filename->_M_dataplus)._M_p,filename->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"\" (failed to set the Unicode character set)",0x2b);
        std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        FT_Stroker_Done(local_48);
      }
      else {
        poVar3 = err();
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Failed to load font \"",0x15);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(filename->_M_dataplus)._M_p,filename->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"\" (failed to create the stroker)",0x20);
        std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      FT_Done_Face(local_50);
      return false;
    }
    poVar3 = err();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Failed to load font \"",0x15);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    pcVar6 = "\" (failed to create the font face)";
    lVar5 = 0x22;
  }
  else {
    poVar3 = err();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Failed to load font \"",0x15);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    pcVar6 = "\" (failed to initialize FreeType)";
    lVar5 = 0x21;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar5);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return false;
}

Assistant:

bool Font::loadFromFile(const std::string& filename)
{
    #ifndef SFML_SYSTEM_ANDROID

    // Cleanup the previous resources
    cleanup();
    m_refCount = new int(1);

    // Initialize FreeType
    // Note: we initialize FreeType for every font instance in order to avoid having a single
    // global manager that would create a lot of issues regarding creation and destruction order.
    FT_Library library;
    if (FT_Init_FreeType(&library) != 0)
    {
        err() << "Failed to load font \"" << filename << "\" (failed to initialize FreeType)" << std::endl;
        return false;
    }
    m_library = library;

    // Load the new font face from the specified file
    FT_Face face;
    if (FT_New_Face(static_cast<FT_Library>(m_library), filename.c_str(), 0, &face) != 0)
    {
        err() << "Failed to load font \"" << filename << "\" (failed to create the font face)" << std::endl;
        return false;
    }

    // Load the stroker that will be used to outline the font
    FT_Stroker stroker;
    if (FT_Stroker_New(static_cast<FT_Library>(m_library), &stroker) != 0)
    {
        err() << "Failed to load font \"" << filename << "\" (failed to create the stroker)" << std::endl;
        FT_Done_Face(face);
        return false;
    }

    // Select the unicode character map
    if (FT_Select_Charmap(face, FT_ENCODING_UNICODE) != 0)
    {
        err() << "Failed to load font \"" << filename << "\" (failed to set the Unicode character set)" << std::endl;
        FT_Stroker_Done(stroker);
        FT_Done_Face(face);
        return false;
    }

    // Store the loaded font in our ugly void* :)
    m_stroker = stroker;
    m_face = face;

    // Store the font information
    m_info.family = face->family_name ? face->family_name : std::string();

    return true;

    #else

    if (m_stream)
        delete static_cast<priv::ResourceStream*>(m_stream);

    m_stream = new priv::ResourceStream(filename);
    return loadFromStream(*static_cast<priv::ResourceStream*>(m_stream));

    #endif
}